

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

RK_S32 util_check_8_pixel_aligned
                 (RK_S32 workaround,RK_S32 hor_stride,RK_S32 pixel_aign,RK_S32 pixel_size,
                 char *fmt_name)

{
  char *fmt_name_local;
  RK_S32 pixel_size_local;
  RK_S32 pixel_aign_local;
  RK_S32 hor_stride_local;
  RK_S32 workaround_local;
  
  pixel_aign_local = workaround;
  if ((workaround == 0) &&
     (hor_stride !=
      ((hor_stride + pixel_aign * pixel_size + -1) / (pixel_aign * pixel_size)) *
      pixel_aign * pixel_size)) {
    _mpp_log_l(4,"utils",
               "warning: vepu only support 8 aligned horizontal stride in pixel for %s with pixel size %d\n"
               ,0,fmt_name,pixel_size);
    _mpp_log_l(4,"utils","set byte stride to %d to match the requirement\n",0,
               ((hor_stride + pixel_aign * pixel_size + -1) / (pixel_aign * pixel_size)) *
               pixel_aign * pixel_size);
    pixel_aign_local = 1;
  }
  return pixel_aign_local;
}

Assistant:

static RK_S32 util_check_8_pixel_aligned(RK_S32 workaround, RK_S32 hor_stride,
                                         RK_S32 pixel_aign, RK_S32 pixel_size,
                                         const char *fmt_name)
{
    if (!workaround && hor_stride != MPP_ALIGN_GEN(hor_stride, pixel_aign * pixel_size)) {
        mpp_log("warning: vepu only support 8 aligned horizontal stride in pixel for %s with pixel size %d\n",
                fmt_name, pixel_size);
        mpp_log("set byte stride to %d to match the requirement\n",
                MPP_ALIGN_GEN(hor_stride, pixel_aign * pixel_size));
        workaround = 1;
    }

    return workaround;
}